

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algorithms.h
# Opt level: O3

basic_string<char> * __thiscall
frozen::bits::LowerBound<frozen::basic_string<char>,std::less<frozen::basic_string<char>>>::
doit_fast<frozen::basic_string<char>const*,31ul>
          (LowerBound<frozen::basic_string<char>,std::less<frozen::basic_string<char>>> *this,
          long first)

{
  long lVar1;
  char cVar2;
  long *plVar3;
  ulong uVar4;
  ulong uVar5;
  bool bVar6;
  basic_string<char> *it;
  long lVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  uint uVar11;
  ulong uVar12;
  
  plVar3 = *(long **)this;
  uVar4 = *(ulong *)(first + 0xf8);
  uVar5 = plVar3[1];
  uVar10 = uVar5;
  if (uVar4 < uVar5) {
    uVar10 = uVar4;
  }
  if (uVar10 != 0) {
    lVar9 = 0;
    uVar8 = 0;
    uVar12 = 1;
    do {
      cVar2 = *(char *)(*(long *)(first + 0xf0) + uVar8);
      if (cVar2 < *(char *)(*plVar3 + uVar8)) goto LAB_0018769d;
      if (*(char *)(*plVar3 + uVar8) < cVar2) goto LAB_001876a6;
      bVar6 = uVar12 < uVar10;
      uVar8 = uVar12;
      uVar12 = (ulong)((int)uVar12 + 1);
    } while (bVar6);
  }
  if (uVar4 < uVar5) {
LAB_0018769d:
    lVar9 = 0x100;
  }
  else {
    lVar9 = 0;
  }
LAB_001876a6:
  lVar1 = first + lVar9;
  uVar4 = *(ulong *)(first + 0x78 + lVar9);
  uVar10 = uVar5;
  if (uVar4 < uVar5) {
    uVar10 = uVar4;
  }
  if (uVar10 != 0) {
    lVar9 = 0;
    uVar8 = 0;
    uVar12 = 1;
    do {
      cVar2 = *(char *)(*(long *)(lVar1 + 0x70) + uVar8);
      if (cVar2 < *(char *)(*plVar3 + uVar8)) goto LAB_001876eb;
      if (*(char *)(*plVar3 + uVar8) < cVar2) goto LAB_001876f4;
      bVar6 = uVar12 < uVar10;
      uVar8 = uVar12;
      uVar12 = (ulong)((int)uVar12 + 1);
    } while (bVar6);
  }
  if (uVar4 < uVar5) {
LAB_001876eb:
    lVar9 = 0x80;
  }
  else {
    lVar9 = 0;
  }
LAB_001876f4:
  lVar7 = lVar1 + lVar9;
  uVar4 = *(ulong *)(lVar1 + 0x38 + lVar9);
  uVar10 = uVar5;
  if (uVar4 < uVar5) {
    uVar10 = uVar4;
  }
  if (uVar10 != 0) {
    lVar9 = 0;
    uVar8 = 0;
    uVar12 = 1;
    do {
      cVar2 = *(char *)(*(long *)(lVar7 + 0x30) + uVar8);
      if (cVar2 < *(char *)(*plVar3 + uVar8)) goto LAB_00187739;
      if (*(char *)(*plVar3 + uVar8) < cVar2) goto LAB_00187742;
      bVar6 = uVar12 < uVar10;
      uVar8 = uVar12;
      uVar12 = (ulong)((int)uVar12 + 1);
    } while (bVar6);
  }
  if (uVar4 < uVar5) {
LAB_00187739:
    lVar9 = 0x40;
  }
  else {
    lVar9 = 0;
  }
LAB_00187742:
  lVar1 = lVar7 + lVar9;
  uVar4 = *(ulong *)(lVar7 + 0x18 + lVar9);
  uVar10 = uVar5;
  if (uVar4 < uVar5) {
    uVar10 = uVar4;
  }
  if (uVar10 != 0) {
    lVar9 = 0;
    uVar8 = 0;
    uVar12 = 1;
    do {
      cVar2 = *(char *)(*(long *)(lVar1 + 0x10) + uVar8);
      if (cVar2 < *(char *)(*plVar3 + uVar8)) goto LAB_00187787;
      if (*(char *)(*plVar3 + uVar8) < cVar2) goto LAB_00187790;
      bVar6 = uVar12 < uVar10;
      uVar8 = uVar12;
      uVar12 = (ulong)((int)uVar12 + 1);
    } while (bVar6);
  }
  if (uVar4 < uVar5) {
LAB_00187787:
    lVar9 = 0x20;
  }
  else {
    lVar9 = 0;
  }
LAB_00187790:
  uVar4 = *(ulong *)(lVar1 + 8 + lVar9);
  uVar10 = uVar5;
  if (uVar4 < uVar5) {
    uVar10 = uVar4;
  }
  if (uVar10 != 0) {
    uVar11 = 1;
    lVar7 = 0;
    uVar8 = 0;
    do {
      cVar2 = *(char *)(*(long *)(lVar1 + lVar9) + uVar8);
      if (cVar2 < *(char *)(*plVar3 + uVar8)) goto LAB_001877d5;
      if (*(char *)(*plVar3 + uVar8) < cVar2) goto LAB_001877de;
      uVar8 = (ulong)uVar11;
      uVar11 = uVar11 + 1;
    } while (uVar8 < uVar10);
  }
  if (uVar4 < uVar5) {
LAB_001877d5:
    lVar7 = 0x10;
  }
  else {
    lVar7 = 0;
  }
LAB_001877de:
  return (basic_string<char> *)(lVar1 + lVar9 + lVar7);
}

Assistant:

inline constexpr ForwardIt doit_fast(ForwardIt first,
                                  std::integral_constant<std::size_t, N>) {
    auto constexpr step = N / 2;
    static_assert(N/2 == N - N / 2 - 1, "power of two minus 1");
    auto it = first + step;
    auto next_it = compare_(*it, value_) ? it + 1 : first;
    return doit_fast(next_it, std::integral_constant<std::size_t, N / 2>{});
  }